

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

int32_t __thiscall icu_63::RuleBasedBreakIterator::getRuleStatus(RuleBasedBreakIterator *this)

{
  int32_t *piVar1;
  
  piVar1 = this->fData->fRuleStatusTable;
  return piVar1[(long)piVar1[this->fRuleStatusIndex] + (long)this->fRuleStatusIndex];
}

Assistant:

int32_t  RuleBasedBreakIterator::getRuleStatus() const {

    // fLastRuleStatusIndex indexes to the start of the appropriate status record
    //                                                 (the number of status values.)
    //   This function returns the last (largest) of the array of status values.
    int32_t  idx = fRuleStatusIndex + fData->fRuleStatusTable[fRuleStatusIndex];
    int32_t  tagVal = fData->fRuleStatusTable[idx];

    return tagVal;
}